

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

void __thiscall CPP::WriteInitialization::acceptLayout(WriteInitialization *this,DomLayout *node)

{
  QStack<DomLayout_*> *this_00;
  Driver *this_01;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  DomProperty *pDVar5;
  QTextStream *pQVar6;
  iterator iVar7;
  iterator iVar8;
  iterator iVar9;
  iterator iVar10;
  bool bVar11;
  int marginType;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QLatin1StringView latin1_02;
  QLatin1StringView latin1_03;
  QLatin1StringView latin1_04;
  QLatin1StringView latin1_05;
  QLatin1StringView latin1_06;
  QLatin1StringView latin1_07;
  QArrayDataPointer<char16_t> local_f8;
  QArrayDataPointer<char16_t> local_e0;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<DomProperty_*> local_a8;
  QArrayDataPointer<DomProperty_*> local_88;
  DomPropertyMap properties;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.d = (node->m_attr_class).d.d;
  local_50.ptr = (node->m_attr_class).d.ptr;
  local_50.size = (node->m_attr_class).d.size;
  if (local_50.d != (Data *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68.size = -0x5555555555555556;
  local_68.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_68.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  Driver::findOrInsertLayout((QString *)&local_68,this->m_driver,node);
  properties.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_88.d = (node->m_property).d.d;
  local_88.ptr = (node->m_property).d.ptr;
  local_88.size = (node->m_property).d.size;
  if (local_88.d != (Data *)0x0) {
    LOCK();
    ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  propertyMap((QList<DomProperty_*> *)&properties);
  QArrayDataPointer<DomProperty_*>::~QArrayDataPointer(&local_88);
  local_88.d = (Data *)0x6;
  local_88.ptr = (DomProperty **)0x16f25d;
  pDVar5 = QHash<QString,_DomProperty_*>::value<QLatin1String,_true>
                     ((QHash<QString,_DomProperty_*> *)&properties,(QLatin1String *)&local_88);
  pQVar6 = (QTextStream *)QTextStream::operator<<(this->m_output,&this->m_indent);
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&local_68);
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6," = ");
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)language::operatorNew);
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&local_50);
  QTextStream::operator<<(pQVar6,'(');
  this_00 = &this->m_layoutChain;
  iVar7 = QList<DomLayout_*>::end(&this_00->super_QList<DomLayout_*>);
  if (iVar7.i[-1] == (DomLayout *)0x0) {
    pQVar6 = this->m_output;
    this_01 = this->m_driver;
    iVar8 = QList<DomWidget_*>::end(&(this->m_widgetChain).super_QList<DomWidget_*>);
    Driver::findOrInsertWidget((QString *)&local_88,this_01,iVar8.i[-1]);
    QTextStream::operator<<(pQVar6,(QString *)&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  }
  pQVar6 = (QTextStream *)QTextStream::operator<<(this->m_output,")");
  QTextStream::operator<<(pQVar6,(QString *)language::eol);
  iVar7 = QList<DomLayout_*>::end(&this_00->super_QList<DomLayout_*>);
  marginType = 0;
  if (pDVar5 != (DomProperty *)0x0) {
    marginType = this->m_layoutMarginType;
  }
  LayoutDefaultHandler::writeProperties
            (&this->m_LayoutDefaultHandler,&this->m_indent,(QString *)&local_68,&properties,
             marginType,iVar7.i[-1] != (DomLayout *)0x0,this->m_output);
  this->m_layoutMarginType = 3;
  local_88.d = (node->m_property).d.d;
  local_88.ptr = (node->m_property).d.ptr;
  local_88.size = (node->m_property).d.size;
  if (local_88.d != (Data *)0x0) {
    LOCK();
    ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_a8.size = 0;
  local_a8.d = (Data *)0x0;
  local_a8.ptr = (DomProperty **)0x0;
  if (this->m_layoutWidget == true) {
    iVar9 = QList<DomProperty_*>::begin((QList<DomProperty_*> *)&local_88);
    iVar10 = QList<DomProperty_*>::end((QList<DomProperty_*> *)&local_88);
    bVar11 = false;
    bVar4 = false;
    bVar3 = false;
    bVar2 = false;
    for (; iVar9.i != iVar10.i; iVar9.i = iVar9.i + 1) {
      pDVar5 = *iVar9.i;
      local_c8.d = (pDVar5->m_attr_name).d.d;
      local_c8.ptr = (pDVar5->m_attr_name).d.ptr;
      local_c8.size = (pDVar5->m_attr_name).d.size;
      if (local_c8.d != (Data *)0x0) {
        LOCK();
        ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_e0.d = (Data *)0xa;
      local_e0.ptr = L"leftMargin";
      bVar1 = operator==((QString *)&local_c8,(QLatin1StringView *)&local_e0);
      if ((bVar1) && (pDVar5->m_kind == Number)) {
        bVar2 = true;
      }
      else {
        local_e0.d = (Data *)0x9;
        local_e0.ptr = L"topMargin";
        bVar1 = operator==((QString *)&local_c8,(QLatin1StringView *)&local_e0);
        if ((bVar1) && (pDVar5->m_kind == Number)) {
          bVar3 = true;
        }
        else {
          local_e0.d = (Data *)0xb;
          local_e0.ptr = L"rightMargin";
          bVar1 = operator==((QString *)&local_c8,(QLatin1StringView *)&local_e0);
          if ((bVar1) && (pDVar5->m_kind == Number)) {
            bVar4 = true;
          }
          else {
            local_e0.d = (Data *)0xc;
            local_e0.ptr = L"bottomMargin";
            bVar1 = operator==((QString *)&local_c8,(QLatin1StringView *)&local_e0);
            if (bVar1) {
              bVar11 = (bool)(bVar11 | pDVar5->m_kind == Number);
            }
          }
        }
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
    }
    if (!bVar2) {
      pDVar5 = (DomProperty *)operator_new(0x178);
      memset(pDVar5,0,0x178);
      latin1.m_data = "leftMargin";
      latin1.m_size = 10;
      QString::QString((QString *)&local_c8,latin1);
      DomProperty::setAttributeName(pDVar5,(QString *)&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
      DomProperty::setElementNumber(pDVar5,0);
      QList<DomProperty_*>::append((QList<DomProperty_*> *)&local_a8,pDVar5);
    }
    if (!bVar3) {
      pDVar5 = (DomProperty *)operator_new(0x178);
      memset(pDVar5,0,0x178);
      latin1_00.m_data = "topMargin";
      latin1_00.m_size = 9;
      QString::QString((QString *)&local_c8,latin1_00);
      DomProperty::setAttributeName(pDVar5,(QString *)&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
      DomProperty::setElementNumber(pDVar5,0);
      QList<DomProperty_*>::append((QList<DomProperty_*> *)&local_a8,pDVar5);
    }
    if (!bVar4) {
      pDVar5 = (DomProperty *)operator_new(0x178);
      memset(pDVar5,0,0x178);
      latin1_01.m_data = "rightMargin";
      latin1_01.m_size = 0xb;
      QString::QString((QString *)&local_c8,latin1_01);
      DomProperty::setAttributeName(pDVar5,(QString *)&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
      DomProperty::setElementNumber(pDVar5,0);
      QList<DomProperty_*>::append((QList<DomProperty_*> *)&local_a8,pDVar5);
    }
    if (!bVar11) {
      pDVar5 = (DomProperty *)operator_new(0x178);
      memset(pDVar5,0,0x178);
      latin1_02.m_data = "bottomMargin";
      latin1_02.m_size = 0xc;
      QString::QString((QString *)&local_c8,latin1_02);
      DomProperty::setAttributeName(pDVar5,(QString *)&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
      DomProperty::setElementNumber(pDVar5,0);
      QList<DomProperty_*>::append((QList<DomProperty_*> *)&local_a8,pDVar5);
    }
    this->m_layoutWidget = false;
  }
  QList<DomProperty_*>::append((QList<DomProperty_*> *)&local_88,(QList<DomProperty_*> *)&local_a8);
  writeProperties(this,(QString *)&local_68,(QString *)&local_50,(DomPropertyList *)&local_88,3);
  QList<DomProperty_*>::clear((QList<DomProperty_*> *)&local_88);
  qDeleteAll<QList<DomProperty*>>((QList<DomProperty_*> *)&local_a8);
  QList<DomProperty_*>::clear((QList<DomProperty_*> *)&local_a8);
  QList<DomLayout_*>::append(&this_00->super_QList<DomLayout_*>,node);
  TreeWalker::acceptLayout(&this->super_TreeWalker,node);
  QList<DomLayout_*>::takeLast(&this_00->super_QList<DomLayout_*>);
  local_c8.size = -0x5555555555555556;
  local_c8.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_c8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)&local_c8,(QChar)0x30);
  latin1_03.m_data = "setStretch";
  latin1_03.m_size = 10;
  QString::QString((QString *)&local_e0,latin1_03);
  local_f8.d = (node->m_attr_stretch).d.d;
  local_f8.ptr = (node->m_attr_stretch).d.ptr;
  local_f8.size = (node->m_attr_stretch).d.size;
  if (local_f8.d != (Data *)0x0) {
    LOCK();
    ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  writePropertyList(this,(QString *)&local_68,(QString *)&local_e0,(QString *)&local_f8,
                    (QString *)&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
  latin1_04.m_data = "setRowStretch";
  latin1_04.m_size = 0xd;
  QString::QString((QString *)&local_e0,latin1_04);
  local_f8.d = (node->m_attr_rowStretch).d.d;
  local_f8.ptr = (node->m_attr_rowStretch).d.ptr;
  local_f8.size = (node->m_attr_rowStretch).d.size;
  if (local_f8.d != (Data *)0x0) {
    LOCK();
    ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  writePropertyList(this,(QString *)&local_68,(QString *)&local_e0,(QString *)&local_f8,
                    (QString *)&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
  latin1_05.m_data = "setColumnStretch";
  latin1_05.m_size = 0x10;
  QString::QString((QString *)&local_e0,latin1_05);
  local_f8.d = (node->m_attr_columnStretch).d.d;
  local_f8.ptr = (node->m_attr_columnStretch).d.ptr;
  local_f8.size = (node->m_attr_columnStretch).d.size;
  if (local_f8.d != (Data *)0x0) {
    LOCK();
    ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  writePropertyList(this,(QString *)&local_68,(QString *)&local_e0,(QString *)&local_f8,
                    (QString *)&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
  latin1_06.m_data = "setColumnMinimumWidth";
  latin1_06.m_size = 0x15;
  QString::QString((QString *)&local_e0,latin1_06);
  local_f8.d = (node->m_attr_columnMinimumWidth).d.d;
  local_f8.ptr = (node->m_attr_columnMinimumWidth).d.ptr;
  local_f8.size = (node->m_attr_columnMinimumWidth).d.size;
  if (local_f8.d != (Data *)0x0) {
    LOCK();
    ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  writePropertyList(this,(QString *)&local_68,(QString *)&local_e0,(QString *)&local_f8,
                    (QString *)&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
  latin1_07.m_data = "setRowMinimumHeight";
  latin1_07.m_size = 0x13;
  QString::QString((QString *)&local_e0,latin1_07);
  local_f8.d = (node->m_attr_rowMinimumHeight).d.d;
  local_f8.ptr = (node->m_attr_rowMinimumHeight).d.ptr;
  local_f8.size = (node->m_attr_rowMinimumHeight).d.size;
  if (local_f8.d != (Data *)0x0) {
    LOCK();
    ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  writePropertyList(this,(QString *)&local_68,(QString *)&local_e0,(QString *)&local_f8,
                    (QString *)&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  QArrayDataPointer<DomProperty_*>::~QArrayDataPointer(&local_a8);
  QArrayDataPointer<DomProperty_*>::~QArrayDataPointer(&local_88);
  QHash<QString,_DomProperty_*>::~QHash(&properties);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteInitialization::acceptLayout(DomLayout *node)
{
    const QString className = node->attributeClass();
    const QString varName = m_driver->findOrInsertLayout(node);

    const DomPropertyMap properties = propertyMap(node->elementProperty());
    const bool oldLayoutProperties = properties.value("margin"_L1) != nullptr;

    bool isGroupBox = false;

    m_output << m_indent << varName << " = " << language::operatorNew << className << '(';

    if (!m_layoutChain.top() && !isGroupBox)
        m_output << m_driver->findOrInsertWidget(m_widgetChain.top());

    m_output << ")" << language::eol;

    // Suppress margin on a read child layout
    const bool suppressMarginDefault = m_layoutChain.top();
    int marginType = Use43UiFile;
    if (oldLayoutProperties)
        marginType = m_layoutMarginType;
    m_LayoutDefaultHandler.writeProperties(m_indent, varName, properties, marginType, suppressMarginDefault, m_output);

    m_layoutMarginType = SubLayoutMargin;

    DomPropertyList propList = node->elementProperty();
    DomPropertyList newPropList;
    if (m_layoutWidget) {
        bool left = false;
        bool top = false;
        bool right = false;
        bool bottom = false;
        for (const DomProperty *p : propList) {
            const QString propertyName = p->attributeName();
            if (propertyName == "leftMargin"_L1 && p->kind() == DomProperty::Number)
                left = true;
            else if (propertyName == "topMargin"_L1 && p->kind() == DomProperty::Number)
                top = true;
            else if (propertyName == "rightMargin"_L1 && p->kind() == DomProperty::Number)
                right = true;
            else if (propertyName == "bottomMargin"_L1 && p->kind() == DomProperty::Number)
                bottom = true;
        }
        if (!left) {
            auto *p = new DomProperty();
            p->setAttributeName("leftMargin"_L1);
            p->setElementNumber(0);
            newPropList.append(p);
        }
        if (!top) {
            auto *p = new DomProperty();
            p->setAttributeName("topMargin"_L1);
            p->setElementNumber(0);
            newPropList.append(p);
        }
        if (!right) {
            auto *p = new DomProperty();
            p->setAttributeName("rightMargin"_L1);
            p->setElementNumber(0);
            newPropList.append(p);
        }
        if (!bottom) {
            auto *p = new DomProperty();
            p->setAttributeName("bottomMargin"_L1);
            p->setElementNumber(0);
            newPropList.append(p);
        }
        m_layoutWidget = false;
    }

    propList.append(newPropList);

    writeProperties(varName, className, propList, WritePropertyIgnoreMargin|WritePropertyIgnoreSpacing);

    // Clean up again:
    propList.clear();
    qDeleteAll(newPropList);
    newPropList.clear();

    m_layoutChain.push(node);
    TreeWalker::acceptLayout(node);
    m_layoutChain.pop();

    // Stretch? (Unless we are compiling for UIC3)
    const QString numberNull(u'0');
    writePropertyList(varName, "setStretch"_L1, node->attributeStretch(), numberNull);
    writePropertyList(varName, "setRowStretch"_L1, node->attributeRowStretch(), numberNull);
    writePropertyList(varName, "setColumnStretch"_L1, node->attributeColumnStretch(), numberNull);
    writePropertyList(varName, "setColumnMinimumWidth"_L1, node->attributeColumnMinimumWidth(), numberNull);
    writePropertyList(varName, "setRowMinimumHeight"_L1, node->attributeRowMinimumHeight(), numberNull);
}